

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O3

void __thiscall
COLLADASaxFWL::KinematicAttachment::addTransformation
          (KinematicAttachment *this,Transformation *transformation)

{
  pointer *pppTVar1;
  iterator __position;
  Transformation *local_8;
  
  __position._M_current =
       (this->mTransformations).
       super__Vector_base<COLLADAFW::Transformation_*,_std::allocator<COLLADAFW::Transformation_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->mTransformations).
      super__Vector_base<COLLADAFW::Transformation_*,_std::allocator<COLLADAFW::Transformation_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = transformation;
    std::vector<COLLADAFW::Transformation*,std::allocator<COLLADAFW::Transformation*>>::
    _M_realloc_insert<COLLADAFW::Transformation*const&>
              ((vector<COLLADAFW::Transformation*,std::allocator<COLLADAFW::Transformation*>> *)
               &this->mTransformations,__position,&local_8);
  }
  else {
    *__position._M_current = transformation;
    pppTVar1 = &(this->mTransformations).
                super__Vector_base<COLLADAFW::Transformation_*,_std::allocator<COLLADAFW::Transformation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  return;
}

Assistant:

void addTransformation( COLLADAFW::Transformation* transformation ) { mTransformations.push_back(transformation); }